

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void * js_realloc2(JSContext *ctx,void *ptr,size_t size,size_t *pslack)

{
  size_t sVar1;
  long lVar2;
  long *in_RCX;
  ulong in_RDX;
  size_t new_size;
  void *ret;
  void *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  JSContext *in_stack_ffffffffffffffc0;
  void *local_8;
  
  local_8 = js_realloc_rt((JSRuntime *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0)
                          ,in_stack_ffffffffffffffa8,0x11c060);
  if (local_8 == (void *)0x0 && in_RDX != 0) {
    JS_ThrowOutOfMemory(in_stack_ffffffffffffffc0);
    local_8 = (void *)0x0;
  }
  else if (in_RCX != (long *)0x0) {
    sVar1 = js_malloc_usable_size_rt
                      ((JSRuntime *)
                       CONCAT17(local_8 == (void *)0x0 && in_RDX != 0,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffa8);
    if (in_RDX < sVar1) {
      lVar2 = sVar1 - in_RDX;
    }
    else {
      lVar2 = 0;
    }
    *in_RCX = lVar2;
  }
  return local_8;
}

Assistant:

void *js_realloc2(JSContext *ctx, void *ptr, size_t size, size_t *pslack)
{
    void *ret;
    ret = js_realloc_rt(ctx->rt, ptr, size);
    if (unlikely(!ret && size != 0)) {
        JS_ThrowOutOfMemory(ctx);
        return NULL;
    }
    if (pslack) {
        size_t new_size = js_malloc_usable_size_rt(ctx->rt, ret);
        *pslack = (new_size > size) ? new_size - size : 0;
    }
    return ret;
}